

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IntegerTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntegerTypeSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,Token *args_2,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_3)

{
  Token signing;
  Token keyword;
  IntegerTypeSyntax *pIVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  Info *in_RSI;
  undefined8 in_R8;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *unaff_retaddr;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  pIVar1 = (IntegerTypeSyntax *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  keyword.info = in_RSI;
  keyword._0_8_ = in_RDX;
  signing.info = in_RCX;
  signing.kind = (short)in_R8;
  signing._2_1_ = (char)((ulong)in_R8 >> 0x10);
  signing.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  signing.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::IntegerTypeSyntax::IntegerTypeSyntax
            ((IntegerTypeSyntax *)in_RDX[1],(SyntaxKind)((ulong)*in_RDX >> 0x20),keyword,signing,
             unaff_retaddr);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }